

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_type_canonicalizeFunctionType(sysbvm_context_t *context,sysbvm_tuple_t functionType)

{
  _Bool _Var1;
  sysbvm_astArgumentNode_t *slotCount;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_bitflags_t flags_00;
  sysbvm_bitflags_t flags;
  sysbvm_tuple_t resultType;
  sysbvm_tuple_t argumentType;
  sysbvm_astArgumentNode_t *argumentNode;
  size_t i_1;
  sysbvm_tuple_t argumentTypes;
  size_t i;
  size_t argumentCount;
  sysbvm_dependentFunctionType_t *dependentFunctionType;
  sysbvm_tuple_t functionType_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isKindOf(context,functionType,(context->roots).dependentFunctionTypeType);
  context_local = (sysbvm_context_t *)functionType;
  if (_Var1) {
    slotCount = (sysbvm_astArgumentNode_t *)
                sysbvm_array_getSize(*(sysbvm_tuple_t *)(functionType + 0x108));
    for (argumentTypes = 0; argumentTypes < slotCount; argumentTypes = argumentTypes + 1) {
      sVar2 = sysbvm_array_at(*(sysbvm_tuple_t *)(functionType + 0x108),argumentTypes);
      _Var1 = canCanonicalizeArgumentNodeType(context,sVar2);
      if (!_Var1) {
        return functionType;
      }
    }
    if ((*(long *)(functionType + 0x110) == 0) ||
       (_Var1 = sysbvm_astNode_isLiteralNode(context,*(sysbvm_tuple_t *)(functionType + 0x110)),
       _Var1)) {
      sVar2 = sysbvm_array_create(context,(sysbvm_tuple_t)slotCount);
      for (argumentNode = (sysbvm_astArgumentNode_t *)0x0; argumentNode < slotCount;
          argumentNode = (sysbvm_astArgumentNode_t *)
                         ((long)&(argumentNode->super).header.field_0 + 1)) {
        sVar3 = sysbvm_array_at(*(sysbvm_tuple_t *)(functionType + 0x108),(size_t)argumentNode);
        resultType = (context->roots).anyValueType;
        if (*(long *)(sVar3 + 0x38) != 0) {
          resultType = sysbvm_astLiteralNode_getValue(*(sysbvm_tuple_t *)(sVar3 + 0x38));
        }
        sysbvm_array_atPut(sVar2,(size_t)argumentNode,resultType);
      }
      flags = (context->roots).anyValueType;
      if (*(long *)(functionType + 0x110) != 0) {
        flags = sysbvm_astLiteralNode_getValue(*(sysbvm_tuple_t *)(functionType + 0x110));
      }
      flags_00 = sysbvm_tuple_bitflags_decode(*(sysbvm_tuple_t *)(functionType + 0xf8));
      context_local =
           (sysbvm_context_t *)sysbvm_type_createSimpleFunctionType(context,sVar2,flags_00,flags);
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_canonicalizeFunctionType(sysbvm_context_t *context, sysbvm_tuple_t functionType)
{
    if(!sysbvm_tuple_isKindOf(context, functionType, context->roots.dependentFunctionTypeType))
        return functionType;

    sysbvm_dependentFunctionType_t *dependentFunctionType = (sysbvm_dependentFunctionType_t*)functionType;
    
    // Only accept literal values for argument types.
    size_t argumentCount = sysbvm_array_getSize(dependentFunctionType->argumentNodes);
    for(size_t i = 0; i < argumentCount; ++i)
    {
        if(!canCanonicalizeArgumentNodeType(context, sysbvm_array_at(dependentFunctionType->argumentNodes, i)))
            return functionType;
    }

    // Check the result type.
    if(dependentFunctionType->resultTypeNode && !sysbvm_astNode_isLiteralNode(context, dependentFunctionType->resultTypeNode))
        return functionType;

    sysbvm_tuple_t argumentTypes = sysbvm_array_create(context, argumentCount);
    for(size_t i = 0; i < argumentCount; ++i)
    {
        sysbvm_astArgumentNode_t *argumentNode = (sysbvm_astArgumentNode_t*)sysbvm_array_at(dependentFunctionType->argumentNodes, i);
        sysbvm_tuple_t argumentType = context->roots.anyValueType;
        if(argumentNode->type)
            argumentType = sysbvm_astLiteralNode_getValue(argumentNode->type);
        sysbvm_array_atPut(argumentTypes, i, argumentType);
    }

    sysbvm_tuple_t resultType = context->roots.anyValueType;
    if(dependentFunctionType->resultTypeNode)
        resultType = sysbvm_astLiteralNode_getValue(dependentFunctionType->resultTypeNode);

    sysbvm_bitflags_t flags = sysbvm_tuple_bitflags_decode(dependentFunctionType->super.functionFlags);
    return sysbvm_type_createSimpleFunctionType(context, argumentTypes, flags, resultType);
}